

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Reg reg2)

{
  x86Instruction *pxVar1;
  ulong uVar2;
  uint uVar3;
  x86Size size;
  ArgType AVar4;
  ulong uVar5;
  x86Reg index;
  int multiplier;
  x86Reg base;
  undefined4 uStack_3c;
  undefined4 uStack_34;
  
  switch(op) {
  case o_add:
  case o_sub:
    uVar2 = (ulong)reg2;
    AVar4 = ctx->genReg[uVar2].type;
    if (AVar4 == argReg) {
      reg2 = ctx->genReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
      AVar4 = ctx->genReg[uVar2].type;
    }
    if (AVar4 == argNumber) {
      uVar3 = ctx->genReg[uVar2].field_1.labelID;
      goto LAB_0027bc52;
    }
    ctx->genRegRead[uVar2] = true;
    goto LAB_0027bc01;
  case o_imul:
    uVar2 = (ulong)reg2;
    if ((ctx->genReg[uVar2].type == argPtr) && (ctx->genReg[uVar2].field_1.reg == rECX)) {
      base = ctx->genReg[uVar2].ptrBase;
      index = ctx->genReg[uVar2].ptrIndex;
      multiplier = ctx->genReg[uVar2].ptrMult;
      uVar3 = ctx->genReg[uVar2].ptrNum;
      op = o_imul;
      size = sDWORD;
      goto LAB_0027bdb0;
    }
    break;
  case o_idiv:
  case o_shl:
  case o_not:
switchD_0027bab3_caseD_22:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x54d,"void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86Reg, x86Reg)"
                 );
  case o_sal:
  case o_sar:
switchD_0027bab3_caseD_24:
    uVar2 = (ulong)reg2;
    AVar4 = ctx->genReg[uVar2].type;
    if (AVar4 == argReg) {
      uVar5 = (ulong)ctx->genReg[uVar2].field_1.reg;
      if (ctx->genReg[uVar5].type == argNumber) goto LAB_0027bc43;
    }
    else if (AVar4 == argNumber) {
      uVar3 = ctx->genReg[uVar2].field_1.labelID;
      uVar5 = uVar2;
      if ((int)(char)uVar3 == uVar3) goto LAB_0027bc52;
LAB_0027bc43:
      uVar3 = ctx->genReg[uVar5].field_1.labelID;
      if ((int)(char)uVar3 == uVar3) {
LAB_0027bc52:
        EMIT_OP_REG_NUM(ctx,op,reg1,uVar3);
        return;
      }
    }
    break;
  case o_xor:
switchD_0027bab3_caseD_29:
    if (reg1 == reg2) {
      CodeGenGenericContext::KillRegister(ctx,reg2);
      CodeGenGenericContext::InvalidateDependand(ctx,reg2);
      reg1 = reg2;
      goto LAB_0027bc0b;
    }
  case o_adc:
  case o_sbb:
  case o_and:
  case o_or:
switchD_0027bab3_caseD_1e:
    uVar2 = (ulong)reg2;
    if (ctx->genReg[uVar2].type == argReg) {
      reg2 = ctx->genReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
    }
    break;
  case o_cmp:
switchD_0027bab3_caseD_2a:
    if (ctx->genReg[reg1].type == argReg) {
      reg1 = ctx->genReg[reg1].field_1.reg;
    }
    uVar2 = (ulong)reg2;
    AVar4 = ctx->genReg[uVar2].type;
    if (AVar4 == argReg) {
      reg2 = ctx->genReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
      AVar4 = ctx->genReg[uVar2].type;
    }
    if (AVar4 == argPtr) {
      size = ctx->genReg[uVar2].field_1.ptrSize;
      if (size == (op != o_cmp) + sDWORD) {
        base = ctx->genReg[uVar2].ptrBase;
        index = ctx->genReg[uVar2].ptrIndex;
        multiplier = ctx->genReg[uVar2].ptrMult;
        uVar3 = ctx->genReg[uVar2].ptrNum;
LAB_0027bdb0:
        EMIT_OP_REG_RPTR(ctx,op,reg1,size,index,multiplier,base,uVar3);
        return;
      }
    }
    else if (AVar4 == argNumber) {
      uVar3 = ctx->genReg[uVar2].field_1.labelID;
      goto LAB_0027bc52;
    }
    ctx->genRegRead[reg1] = true;
    ctx->genRegRead[uVar2] = true;
    goto LAB_0027bc0b;
  case o_test:
    if (ctx->genReg[reg1].type == argReg) {
      reg1 = ctx->genReg[reg1].field_1.reg;
    }
    uVar2 = (ulong)reg2;
    if (ctx->genReg[uVar2].type == argReg) {
      reg2 = ctx->genReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
    }
    ctx->genRegRead[reg1] = true;
    ctx->genRegRead[uVar2] = true;
    goto LAB_0027bc0b;
  default:
    switch(op) {
    case o_neg64:
    case o_idiv64:
    case o_not64:
      goto switchD_0027bab3_caseD_22;
    case o_add64:
    case o_sub64:
    case o_and64:
    case o_or64:
      goto switchD_0027bab3_caseD_1e;
    case o_imul64:
      uVar2 = (ulong)reg2;
      if ((ctx->genReg[uVar2].type == argPtr) && (ctx->genReg[uVar2].field_1.reg == rEDX)) {
        base = ctx->genReg[uVar2].ptrBase;
        index = ctx->genReg[uVar2].ptrIndex;
        multiplier = ctx->genReg[uVar2].ptrMult;
        uVar3 = ctx->genReg[uVar2].ptrNum;
        op = o_imul64;
        size = sQWORD;
        goto LAB_0027bdb0;
      }
      goto LAB_0027bbf9;
    case o_sal64:
    case o_sar64:
      goto switchD_0027bab3_caseD_24;
    case o_xor64:
      goto switchD_0027bab3_caseD_29;
    case o_cmp64:
      goto switchD_0027bab3_caseD_2a;
    default:
      if (op != o_mov) goto switchD_0027bab3_caseD_22;
    case o_mov64:
      if (ctx->skipTracking == false) {
        if (ctx->genReg[reg2].type == argReg) {
          reg2 = ctx->genReg[reg2].field_1.reg;
        }
        if (reg2 == reg1) {
          ctx->optimizationCount = ctx->optimizationCount + 1;
          return;
        }
        ctx->genRegRead[reg2] = true;
        CodeGenGenericContext::OverwriteRegisterWithValue
                  (ctx,reg1,(x86Argument)
                            ZEXT1632(CONCAT88(CONCAT44(uStack_34,reg2),CONCAT44(uStack_3c,2))));
      }
    }
    goto LAB_0027bc0b;
  }
LAB_0027bbf9:
  ctx->genRegRead[uVar2] = true;
LAB_0027bc01:
  CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
LAB_0027bc0b:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argReg;
  (pxVar1->argA).field_1.reg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argReg;
  (pxVar1->argB).field_1.reg = reg2;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_xor:
	case o_xor64:
		if(reg1 == reg2)
		{
			ctx.KillRegister(reg1);
			ctx.InvalidateDependand(reg1);
		}
		else
		{
			reg2 = ctx.RedirectRegister(reg2);

			ctx.ReadRegister(reg2);
			ctx.ReadAndModifyRegister(reg1);
		}
		break;
	case o_cmp:
	case o_cmp64:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == (op == o_cmp ? sDWORD : sQWORD))
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_test:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_add:
	case o_sub:
		reg2 = ctx.RedirectRegister(reg2);

		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// TODO: if there is a known number in destination, we can perform a lea

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_adc:
	case o_sbb:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_add64:
	case o_sub64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		// Can't redirect source register since the instruction has it fixed to ecx

		if(ctx.genReg[reg2].type == x86Argument::argNumber && (char)ctx.genReg[reg2].num == ctx.genReg[reg2].num)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		{
			x86Reg redirect = ctx.RedirectRegister(reg2);

			if(ctx.genReg[redirect].type == x86Argument::argNumber && (char)ctx.genReg[redirect].num == ctx.genReg[redirect].num)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[redirect].num);
				return;
			}
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and:
	case o_or:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and64:
	case o_or64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sDWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul64:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sQWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		reg2 = ctx.RedirectRegister(reg2);

		// Skip self-assignment
		if(reg1 == reg2)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}